

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IteratorHelper.cpp
# Opt level: O0

uint64_t anon_unknown.dwarf_f53e7::getNextDist(uint64_t n,uint64_t dist)

{
  uint64_t uVar1;
  unsigned_long *puVar2;
  unsigned_long in_RSI;
  undefined8 in_RDI;
  double dVar3;
  undefined1 auVar4 [16];
  uint64_t maxDist;
  uint64_t minDist;
  uint64_t tinyDist;
  double x;
  unsigned_long local_30;
  ulong local_28;
  unsigned_long local_20;
  double local_18;
  unsigned_long local_10 [2];
  
  auVar4._8_4_ = (int)((ulong)in_RDI >> 0x20);
  auVar4._0_8_ = in_RDI;
  auVar4._12_4_ = 0x45300000;
  local_18 = (auVar4._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)in_RDI) - 4503599627370496.0);
  local_10[0] = in_RSI;
  uVar1 = primesieve::PrimeGenerator::maxCachedPrime();
  local_20 = uVar1 << 2;
  dVar3 = sqrt(local_18);
  local_28 = (long)dVar3 | (long)(dVar3 - 9.223372036854776e+18) & (long)dVar3 >> 0x3f;
  local_30 = 0x1000000000000000;
  local_10[0] = local_10[0] << 2;
  puVar2 = std::max<unsigned_long>(local_10,&local_20);
  local_10[0] = *puVar2;
  puVar2 = std::max<unsigned_long>(local_10,&local_28);
  local_10[0] = *puVar2;
  puVar2 = std::min<unsigned_long>(local_10,&local_30);
  return *puVar2;
}

Assistant:

uint64_t getNextDist(uint64_t n, uint64_t dist)
{
  double x = (double) n;
  uint64_t tinyDist = PrimeGenerator::maxCachedPrime() * 4;
  uint64_t minDist = (uint64_t) sqrt(x);
  uint64_t maxDist = 1ull << 60;

  dist *= 4;
  dist = max(dist, tinyDist);
  dist = max(dist, minDist);
  dist = min(dist, maxDist);

  return dist;
}